

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

char * __thiscall
cmCompiledGeneratorExpression::Evaluate
          (cmCompiledGeneratorExpression *this,cmLocalGenerator *lg,string *config,bool quiet,
          cmGeneratorTarget *headTarget,cmGeneratorTarget *currentTarget,
          cmGeneratorExpressionDAGChecker *dagChecker,string *language)

{
  char *pcVar1;
  cmGeneratorExpressionContext context;
  
  if (currentTarget == (cmGeneratorTarget *)0x0) {
    currentTarget = headTarget;
  }
  cmGeneratorExpressionContext::cmGeneratorExpressionContext
            (&context,lg,config,quiet,headTarget,currentTarget,this->EvaluateForBuildsystem,
             &this->Backtrace,language);
  pcVar1 = EvaluateWithContext(this,&context,dagChecker);
  cmGeneratorExpressionContext::~cmGeneratorExpressionContext(&context);
  return pcVar1;
}

Assistant:

const char* cmCompiledGeneratorExpression::Evaluate(
  cmLocalGenerator* lg, const std::string& config, bool quiet,
  const cmGeneratorTarget* headTarget, const cmGeneratorTarget* currentTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  std::string const& language) const
{
  cmGeneratorExpressionContext context(
    lg, config, quiet, headTarget, currentTarget ? currentTarget : headTarget,
    this->EvaluateForBuildsystem, this->Backtrace, language);

  return this->EvaluateWithContext(context, dagChecker);
}